

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSat3.c
# Opt level: O3

sat_solver3 * Gia_ManSat3Create(Gia_Man_t *p)

{
  int iVar1;
  Cnf_Dat_t *pCnf;
  sat_solver3 *s;
  
  pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,1,0,0);
  s = Gia_ManSat3Init(pCnf);
  if (s == (sat_solver3 *)0x0) {
    Cnf_DataFree(pCnf);
  }
  else {
    iVar1 = sat_solver3_simplify(s);
    Cnf_DataFree(pCnf);
    if (iVar1 != 0) {
      return s;
    }
    sat_solver3_delete(s);
  }
  return (sat_solver3 *)0x0;
}

Assistant:

sat_solver3 * Gia_ManSat3Create( Gia_Man_t * p )
{
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 1, 0, 0 );
    sat_solver3 * pSat = Gia_ManSat3Init( pCnf );
    int status = pSat ? sat_solver3_simplify(pSat) : 0;
    Cnf_DataFree( pCnf );
    if ( status )
        return pSat;
    if ( pSat )
        sat_solver3_delete( pSat );
    return NULL;
}